

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpack.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  undefined8 uVar4;
  size_type sVar5;
  _func_int **pp_Var6;
  bool bVar7;
  int iVar8;
  int iVar9;
  char **argv_00;
  size_t sVar10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  char *pcVar13;
  char *pcVar14;
  char *__s;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar15;
  bool collapse;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 extraout_DL_05;
  undefined1 extraout_DL_06;
  undefined1 extraout_DL_07;
  undefined1 extraout_DL_08;
  undefined1 extraout_DL_09;
  undefined1 extraout_DL_10;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  bool bVar19;
  bool help;
  bool traceExpand;
  bool trace;
  bool verbose;
  bool debug;
  bool system;
  bool helpVersion;
  ostringstream cmCPackLog_msg_4;
  string cpackConfigFile;
  CommandLineArguments arg;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> v;
  string cpackProjectDirectory;
  bool system_1;
  string cpackProjectVendor;
  string cpackProjectVersion;
  string cpackBuildConfig;
  string cpackProjectName;
  string generator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generatorsVector;
  string systemFile;
  string cpackProjectPatch;
  string helpHTML;
  string helpMAN;
  string helpFull;
  CommandLineArguments args;
  cpackDefinitions definitions;
  cmCPackLog log;
  cmDocumentation doc;
  cmCPackGeneratorFactory generators;
  cmMakefile globalMF;
  cmGlobalGenerator cmgg;
  cmake cminst;
  undefined1 auStack_1948 [11];
  bool local_193d;
  bool local_193c;
  bool local_193b;
  bool local_193a;
  bool local_1939;
  undefined1 local_1938 [32];
  _Alloc_hider local_1918;
  size_type local_1910;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1908;
  char local_18f8;
  bool local_18e9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_18e8;
  string *local_18e0;
  undefined1 local_18d8 [8];
  _Alloc_hider _Stack_18d0;
  undefined1 local_18c8 [8];
  undefined1 local_18c0 [16];
  pointer local_18b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18a8;
  char local_1898;
  _Alloc_hider local_1880;
  undefined1 local_1870 [16];
  vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
  local_1860;
  cmDocumentationFormatter local_1848 [10];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1758;
  pointer local_1750;
  uint local_1744;
  string local_1740;
  CommandLineArguments local_1720;
  _Alloc_hider local_16f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_16e8;
  undefined1 local_16e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_16c8;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> local_16b8;
  string local_1690;
  undefined1 local_1670 [32];
  char *local_1650;
  string local_1648;
  string local_1628;
  string local_1608;
  string local_15e8;
  string local_15c8;
  string local_15a8;
  string local_1588;
  string local_1568;
  string local_1548;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1528;
  string local_1508;
  string local_14e8;
  string *local_14c8;
  string local_14c0;
  string local_14a0;
  string local_1480;
  string local_1460;
  string local_1440;
  CommandLineArguments local_1420;
  ProgressCallbackType local_1408;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_13e0;
  cmCPackLog *local_13b0;
  undefined1 local_13a8 [72];
  string local_1360 [64];
  string local_1320 [32];
  string local_1300 [96];
  cmDocumentation local_12a0;
  cmCPackGeneratorFactory local_11f8;
  undefined1 local_1178 [112];
  ios_base local_1108 [1912];
  cmGlobalGenerator local_990;
  cmake local_388;
  
  cmsys::Encoding::CommandLineArguments::Main(&local_1420,argc,argv);
  iVar8 = cmsys::Encoding::CommandLineArguments::argc(&local_1420);
  argv_00 = cmsys::Encoding::CommandLineArguments::argv(&local_1420);
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(*argv_00);
  cmCPackLog::cmCPackLog((cmCPackLog *)local_13a8);
  pcVar1 = local_1178 + 0x10;
  local_1178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"CPack Error: ","");
  std::__cxx11::string::_M_assign(local_1300);
  if ((pointer)local_1178._0_8_ != pcVar1) {
    operator_delete((void *)local_1178._0_8_,local_1178._16_8_ + 1);
  }
  local_1178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"CPack Warning: ","");
  std::__cxx11::string::_M_assign(local_1320);
  if ((pointer)local_1178._0_8_ != pcVar1) {
    operator_delete((void *)local_1178._0_8_,local_1178._16_8_ + 1);
  }
  local_1178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"CPack: ","");
  std::__cxx11::string::_M_assign((string *)(local_13a8 + 0x28));
  if ((pointer)local_1178._0_8_ != pcVar1) {
    operator_delete((void *)local_1178._0_8_,local_1178._16_8_ + 1);
  }
  local_1178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"CPack Verbose: ","");
  std::__cxx11::string::_M_assign(local_1360);
  uVar15 = extraout_DL;
  if ((pointer)local_1178._0_8_ != pcVar1) {
    operator_delete((void *)local_1178._0_8_,local_1178._16_8_ + 1);
    uVar15 = extraout_DL_00;
  }
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)local_1178,(SystemTools *)0x1,(bool)uVar15);
  uVar4 = local_1178._8_8_;
  if ((pointer)local_1178._0_8_ != pcVar1) {
    operator_delete((void *)local_1178._0_8_,local_1178._16_8_ + 1);
  }
  if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)uVar4 ==
      (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1178);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1178,"Current working directory cannot be established.",0x30);
    std::ios::widen((char)(ostream *)local_1178 + (char)*(undefined8 *)(local_1178._0_8_ + -0x18));
    std::ostream::put((char)local_1178);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    pp_Var6 = local_990._vptr_cmGlobalGenerator;
    sVar10 = strlen((char *)local_990._vptr_cmGlobalGenerator);
    cmCPackLog::Log((cmCPackLog *)local_13a8,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                    ,0x7e,(char *)pp_Var6,sVar10);
    if ((string *)local_990._vptr_cmGlobalGenerator != &local_990.MakeSilentFlag) {
      operator_delete(local_990._vptr_cmGlobalGenerator,
                      (ulong)(local_990.MakeSilentFlag._M_dataplus._M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1178);
    std::ios_base::~ios_base(local_1108);
    uVar17 = 1;
    goto LAB_00140bf2;
  }
  local_1548._M_dataplus._M_p = (pointer)&local_1548.field_2;
  local_1548._M_string_length = 0;
  local_1548.field_2._M_local_buf[0] = '\0';
  local_193d = false;
  local_18e9 = false;
  local_193a = false;
  local_193b = false;
  local_193c = false;
  local_1939 = false;
  local_1440._M_dataplus._M_p = (pointer)&local_1440.field_2;
  local_1440._M_string_length = 0;
  local_1440.field_2._M_local_buf[0] = '\0';
  local_1460._M_dataplus._M_p = (pointer)&local_1460.field_2;
  local_1460._M_string_length = 0;
  local_1460.field_2._M_local_buf[0] = '\0';
  local_1480._M_dataplus._M_p = (pointer)&local_1480.field_2;
  local_1480._M_string_length = 0;
  local_1480.field_2._M_local_buf[0] = '\0';
  local_1568._M_dataplus._M_p = (pointer)&local_1568.field_2;
  local_1568._M_string_length = 0;
  local_1568.field_2._M_local_buf[0] = '\0';
  local_1648._M_dataplus._M_p = (pointer)&local_1648.field_2;
  local_1648._M_string_length = 0;
  local_1648.field_2._M_local_buf[0] = '\0';
  local_1588._M_dataplus._M_p = (pointer)&local_1588.field_2;
  local_1588._M_string_length = 0;
  local_1588.field_2._M_local_buf[0] = '\0';
  local_15a8._M_dataplus._M_p = (pointer)&local_15a8.field_2;
  local_15a8._M_string_length = 0;
  local_15a8.field_2._M_local_buf[0] = '\0';
  local_14a0._M_dataplus._M_p = (pointer)&local_14a0.field_2;
  local_14a0._M_string_length = 0;
  local_14a0.field_2._M_local_buf[0] = '\0';
  local_15c8._M_dataplus._M_p = (pointer)&local_15c8.field_2;
  local_15c8._M_string_length = 0;
  local_15c8.field_2._M_local_buf[0] = '\0';
  local_1740._M_dataplus._M_p = (pointer)&local_1740.field_2;
  local_1740._M_string_length = 0;
  local_1740.field_2._M_local_buf[0] = '\0';
  local_13e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_13e0._M_impl.super__Rb_tree_header._M_header;
  local_13e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_13e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_13e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_13e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_13e0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_13b0 = (cmCPackLog *)local_13a8;
  cmsys::CommandLineArguments::CommandLineArguments(&local_1720);
  cmsys::CommandLineArguments::Initialize(&local_1720,iVar8,argv_00);
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"--help",NO_ARGUMENT,&local_193d,"CPack help");
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"--help-full",SPACE_ARGUMENT,&local_1440,"CPack help");
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"--help-html",SPACE_ARGUMENT,&local_1480,"CPack help");
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"--help-man",SPACE_ARGUMENT,&local_1460,"CPack help");
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"--version",NO_ARGUMENT,&local_18e9,"CPack help");
  cmsys::CommandLineArguments::AddArgument(&local_1720,"-V",NO_ARGUMENT,&local_193a,"CPack verbose")
  ;
  cmsys::CommandLineArguments::AddArgument(&local_1720,"--verbose",NO_ARGUMENT,&local_193a,"-V");
  cmsys::CommandLineArguments::AddArgument(&local_1720,"--debug",NO_ARGUMENT,&local_1939,"-V");
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"--config",SPACE_ARGUMENT,&local_1740,"CPack configuration file");
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"--trace",NO_ARGUMENT,&local_193b,
             "Put underlying cmake scripts in trace mode.");
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"--trace-expand",NO_ARGUMENT,&local_193c,
             "Put underlying cmake scripts in expanded trace mode.");
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"-C",SPACE_ARGUMENT,&local_1588,"CPack build configuration");
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"-G",SPACE_ARGUMENT,&local_1548,"CPack generator");
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"-P",SPACE_ARGUMENT,&local_1568,"CPack project name");
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"-R",SPACE_ARGUMENT,&local_15a8,"CPack project version");
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"-B",SPACE_ARGUMENT,&local_1648,"CPack project directory");
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"--patch",SPACE_ARGUMENT,&local_14a0,"CPack project patch");
  cmsys::CommandLineArguments::AddArgument
            (&local_1720,"--vendor",SPACE_ARGUMENT,&local_15c8,"CPack project vendor");
  cmsys::CommandLineArguments::AddCallback
            (&local_1720,"-D",SPACE_ARGUMENT,cpackDefinitionArgument,&local_13e0,"CPack Definitions"
            );
  cmsys::CommandLineArguments::SetUnknownArgumentCallback(&local_1720,cpackUnknownArgument);
  iVar9 = cmsys::CommandLineArguments::Parse(&local_1720);
  if (local_193a == true) {
    local_13a8[0] = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1178);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1178,"Enable Verbose",0xe);
    std::ios::widen((char)(ostream *)local_1178 + (char)*(undefined8 *)(local_1178._0_8_ + -0x18));
    std::ostream::put((char)local_1178);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    pp_Var6 = local_990._vptr_cmGlobalGenerator;
    sVar10 = strlen((char *)local_990._vptr_cmGlobalGenerator);
    cmCPackLog::Log((cmCPackLog *)local_13a8,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                    ,0xc6,(char *)pp_Var6,sVar10);
    if ((string *)local_990._vptr_cmGlobalGenerator != &local_990.MakeSilentFlag) {
      operator_delete(local_990._vptr_cmGlobalGenerator,
                      (ulong)(local_990.MakeSilentFlag._M_dataplus._M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1178);
    std::ios_base::~ios_base(local_1108);
  }
  if (local_1939 == true) {
    local_13a8[1] = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1178);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1178,"Enable Debug",0xc);
    std::ios::widen((char)(ostream *)local_1178 + (char)*(undefined8 *)(local_1178._0_8_ + -0x18));
    std::ostream::put((char)local_1178);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    pp_Var6 = local_990._vptr_cmGlobalGenerator;
    sVar10 = strlen((char *)local_990._vptr_cmGlobalGenerator);
    cmCPackLog::Log((cmCPackLog *)local_13a8,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                    ,0xca,(char *)pp_Var6,sVar10);
    if ((string *)local_990._vptr_cmGlobalGenerator != &local_990.MakeSilentFlag) {
      operator_delete(local_990._vptr_cmGlobalGenerator,
                      (ulong)(local_990.MakeSilentFlag._M_dataplus._M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1178);
    std::ios_base::~ios_base(local_1108);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1178);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1178,"Read CPack config file: ",0x18);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1178,local_1740._M_dataplus._M_p,local_1740._M_string_length
                      );
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  pp_Var6 = local_990._vptr_cmGlobalGenerator;
  sVar10 = strlen((char *)local_990._vptr_cmGlobalGenerator);
  cmCPackLog::Log((cmCPackLog *)local_13a8,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                  ,0xce,(char *)pp_Var6,sVar10);
  if ((string *)local_990._vptr_cmGlobalGenerator != &local_990.MakeSilentFlag) {
    operator_delete(local_990._vptr_cmGlobalGenerator,
                    (ulong)(local_990.MakeSilentFlag._M_dataplus._M_p + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1178);
  std::ios_base::~ios_base(local_1108);
  cmake::cmake(&local_388,RoleScript,CPack);
  local_1178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"");
  cmake::SetHomeDirectory(&local_388,(string *)local_1178);
  if ((pointer)local_1178._0_8_ != pcVar1) {
    operator_delete((void *)local_1178._0_8_,local_1178._16_8_ + 1);
  }
  local_1178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"");
  cmake::SetHomeOutputDirectory(&local_388,(string *)local_1178);
  if ((pointer)local_1178._0_8_ != pcVar1) {
    operator_delete((void *)local_1178._0_8_,local_1178._16_8_ + 1);
  }
  local_1408.super__Function_base._M_functor._8_8_ = 0;
  local_1408.super__Function_base._M_functor._M_unused._M_object = cpackProgressCallback;
  local_1408._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
       ::_M_invoke;
  local_1408.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
       ::_M_manager;
  cmake::SetProgressCallback(&local_388,&local_1408);
  if (local_1408.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1408.super__Function_base._M_manager)
              ((_Any_data *)&local_1408,(_Any_data *)&local_1408,__destroy_functor);
  }
  local_1178._16_8_ = local_388.CurrentSnapshot.Position.Position;
  local_1178._0_8_ = local_388.CurrentSnapshot.State;
  local_1178._8_8_ = local_388.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_1178);
  cmGlobalGenerator::cmGlobalGenerator(&local_990,&local_388);
  local_18c8 = (undefined1  [8])local_388.CurrentSnapshot.Position.Position;
  local_18d8 = (undefined1  [8])local_388.CurrentSnapshot.State;
  _Stack_18d0._M_p = (pointer)local_388.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile((cmMakefile *)local_1178,&local_990,(cmStateSnapshot *)local_18d8);
  sVar5 = local_1740._M_string_length;
  if (local_193b == true) {
    local_388.Trace = true;
  }
  if (local_193c == true) {
    local_388.Trace = true;
    local_388.TraceExpand = true;
  }
  if ((pointer)local_1740._M_string_length == (pointer)0x0) {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)local_18d8,(SystemTools *)0x1,collapse);
    std::__cxx11::string::operator=((string *)&local_1740,(string *)local_18d8);
    if (local_18d8 != (undefined1  [8])local_18c8) {
      operator_delete((void *)local_18d8,(long)local_18c8 + 1);
    }
    std::__cxx11::string::append((char *)&local_1740);
  }
  cmCPackGeneratorFactory::cmCPackGeneratorFactory(&local_11f8);
  local_11f8.Logger = (cmCPackLog *)local_13a8;
  cmDocumentation::cmDocumentation(&local_12a0);
  cmDocumentation::addCPackStandardDocSections(&local_12a0);
  local_193d = cmDocumentation::CheckOptions(&local_12a0,iVar8,argv_00,"-G");
  local_193d = iVar8 != 1 && local_193d;
  cmake::AddCMakePaths(&local_388);
  if ((iVar9 == 0) || (local_193d != false)) {
LAB_001407ab:
    if (local_193d == true) {
      local_18d8 = (undefined1  [8])local_18c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_18d8,"cpack","");
      cmDocumentation::SetName(&local_12a0,(string *)local_18d8);
      if (local_18d8 != (undefined1  [8])local_18c8) {
        operator_delete((void *)local_18d8,(long)local_18c8 + 1);
      }
      cmDocumentation::SetSection(&local_12a0,"Name",cmDocumentationName);
      cmDocumentation::SetSection(&local_12a0,"Usage",cmDocumentationUsage);
      cmDocumentation::PrependSection(&local_12a0,"Options",cmDocumentationOptions);
      local_1938._0_8_ = (char *)0x0;
      local_1938._8_8_ = (pointer)0x0;
      local_1938._16_8_ = 0;
      if ((_Rb_tree_header *)
          local_11f8.GeneratorDescriptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_11f8.GeneratorDescriptions._M_t._M_impl.super__Rb_tree_header) {
        p_Var12 = local_11f8.GeneratorDescriptions._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        do {
          _Stack_18d0._M_p = (pointer)0x0;
          local_18c8 = (undefined1  [8])((ulong)local_18c8 & 0xffffffffffffff00);
          local_18b0 = (pointer)0x0;
          local_18a8._M_local_buf[0] = '\0';
          local_1898 = ' ';
          local_18d8 = (undefined1  [8])local_18c8;
          local_18c0._8_8_ = &local_18a8;
          std::__cxx11::string::_M_assign((string *)local_18d8);
          std::__cxx11::string::_M_assign((string *)(local_18c0 + 8));
          std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
          emplace_back<cmDocumentationEntry>
                    ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)
                     local_1938,(cmDocumentationEntry *)local_18d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_18c0._8_8_ != &local_18a8) {
            operator_delete((void *)local_18c0._8_8_,
                            CONCAT71(local_18a8._M_allocated_capacity._1_7_,
                                     local_18a8._M_local_buf[0]) + 1);
          }
          if (local_18d8 != (undefined1  [8])local_18c8) {
            operator_delete((void *)local_18d8,(long)local_18c8 + 1);
          }
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        } while ((_Rb_tree_header *)p_Var12 !=
                 &local_11f8.GeneratorDescriptions._M_t._M_impl.super__Rb_tree_header);
      }
      cmDocumentation::SetSection
                (&local_12a0,"Generators",
                 (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_1938);
      bVar7 = cmDocumentation::PrintRequestedDocumentation(&local_12a0,(ostream *)&std::cout);
      uVar17 = (uint)!bVar7;
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
                ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_1938);
    }
    else {
      bVar7 = true;
      if ((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false))
      {
        bVar7 = cmSystemTools::GetInterruptFlag();
      }
      uVar17 = (uint)bVar7;
    }
  }
  else {
    local_18d8 = (undefined1  [8])local_18c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_18d8,"CMakeDetermineSystem.cmake","");
    cmMakefile::GetModulesFile
              (&local_14c0,(cmMakefile *)local_1178,(string *)local_18d8,(bool *)local_1938);
    if (local_18d8 != (undefined1  [8])local_18c8) {
      operator_delete((void *)local_18d8,(long)local_18c8 + 1);
    }
    bVar7 = cmMakefile::ReadListFile((cmMakefile *)local_1178,&local_14c0);
    if (bVar7) {
      local_1938._0_8_ = local_1938 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1938,"CMakeSystemSpecificInformation.cmake","");
      cmMakefile::GetModulesFile
                ((string *)local_18d8,(cmMakefile *)local_1178,(string *)local_1938,
                 (bool *)&local_15e8);
      std::__cxx11::string::operator=((string *)&local_14c0,(string *)local_18d8);
      if (local_18d8 != (undefined1  [8])local_18c8) {
        operator_delete((void *)local_18d8,(long)local_18c8 + 1);
      }
      if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
        operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
      }
      bVar7 = cmMakefile::ReadListFile((cmMakefile *)local_1178,&local_14c0);
      if (!bVar7) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_18d8,"Error reading CMakeSystemSpecificInformation.cmake",0x32);
        std::ios::widen((char)(ostream *)local_18d8 +
                        (char)*(undefined8 *)((long)local_18d8 + -0x18));
        std::ostream::put((char)local_18d8);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        uVar4 = local_1938._0_8_;
        sVar10 = strlen((char *)local_1938._0_8_);
        cmCPackLog::Log((cmCPackLog *)local_13a8,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                        ,0x10a,(char *)uVar4,sVar10);
        goto LAB_0014074a;
      }
      if (local_1588._M_string_length != 0) {
        local_18d8 = (undefined1  [8])local_18c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_18d8,"CPACK_BUILD_CONFIG","");
        cmMakefile::AddDefinition
                  ((cmMakefile *)local_1178,(string *)local_18d8,local_1588._M_dataplus._M_p);
        if (local_18d8 != (undefined1  [8])local_18c8) {
          operator_delete((void *)local_18d8,(long)local_18c8 + 1);
        }
      }
      bVar7 = cmsys::SystemTools::FileExists(&local_1740);
      if (bVar7) {
        cmsys::SystemTools::CollapseFullPath((string *)local_18d8,&local_1740);
        std::__cxx11::string::operator=((string *)&local_1740,(string *)local_18d8);
        if (local_18d8 != (undefined1  [8])local_18c8) {
          operator_delete((void *)local_18d8,(long)local_18c8 + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_18d8,"Read CPack configuration file: ",0x1f);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_18d8,local_1740._M_dataplus._M_p,
                             local_1740._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar11);
        std::__cxx11::stringbuf::str();
        uVar4 = local_1938._0_8_;
        sVar10 = strlen((char *)local_1938._0_8_);
        cmCPackLog::Log((cmCPackLog *)local_13a8,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                        ,0x116,(char *)uVar4,sVar10);
        if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
          operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18d8);
        std::ios_base::~ios_base((ios_base *)(local_1870 + 8));
        bVar7 = cmMakefile::ReadListFile((cmMakefile *)local_1178,&local_1740);
        uVar15 = extraout_DL_02;
        if (!bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_18d8,"Problem reading CPack config file: \"",0x24);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_18d8,local_1740._M_dataplus._M_p,
                               local_1740._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
          std::endl<char,std::char_traits<char>>(poVar11);
          std::__cxx11::stringbuf::str();
          uVar4 = local_1938._0_8_;
          sVar10 = strlen((char *)local_1938._0_8_);
          cmCPackLog::Log((cmCPackLog *)local_13a8,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                          ,0x11a,(char *)uVar4,sVar10);
          goto LAB_0014074a;
        }
      }
      else {
        uVar15 = extraout_DL_01;
        if ((pointer)sVar5 != (pointer)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_18d8,"Cannot find CPack config file: \"",0x20);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_18d8,local_1740._M_dataplus._M_p,
                               local_1740._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
          std::endl<char,std::char_traits<char>>(poVar11);
          std::__cxx11::stringbuf::str();
          uVar4 = local_1938._0_8_;
          sVar10 = strlen((char *)local_1938._0_8_);
          cmCPackLog::Log((cmCPackLog *)local_13a8,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                          ,0x120,(char *)uVar4,sVar10);
          goto LAB_0014074a;
        }
      }
      if (local_1548._M_string_length != 0) {
        local_18d8 = (undefined1  [8])local_18c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_18d8,"CPACK_GENERATOR","");
        cmMakefile::AddDefinition
                  ((cmMakefile *)local_1178,(string *)local_18d8,local_1548._M_dataplus._M_p);
        uVar15 = extraout_DL_03;
        if (local_18d8 != (undefined1  [8])local_18c8) {
          operator_delete((void *)local_18d8,(long)local_18c8 + 1);
          uVar15 = extraout_DL_04;
        }
      }
      if (local_1568._M_string_length != 0) {
        local_18d8 = (undefined1  [8])local_18c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_18d8,"CPACK_PACKAGE_NAME","");
        cmMakefile::AddDefinition
                  ((cmMakefile *)local_1178,(string *)local_18d8,local_1568._M_dataplus._M_p);
        uVar15 = extraout_DL_05;
        if (local_18d8 != (undefined1  [8])local_18c8) {
          operator_delete((void *)local_18d8,(long)local_18c8 + 1);
          uVar15 = extraout_DL_06;
        }
      }
      if (local_15a8._M_string_length != 0) {
        local_18d8 = (undefined1  [8])local_18c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_18d8,"CPACK_PACKAGE_VERSION","");
        cmMakefile::AddDefinition
                  ((cmMakefile *)local_1178,(string *)local_18d8,local_15a8._M_dataplus._M_p);
        uVar15 = extraout_DL_07;
        if (local_18d8 != (undefined1  [8])local_18c8) {
          operator_delete((void *)local_18d8,(long)local_18c8 + 1);
          uVar15 = extraout_DL_08;
        }
      }
      if (local_15c8._M_string_length != 0) {
        local_18d8 = (undefined1  [8])local_18c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_18d8,"CPACK_PACKAGE_VENDOR","");
        cmMakefile::AddDefinition
                  ((cmMakefile *)local_1178,(string *)local_18d8,local_15c8._M_dataplus._M_p);
        uVar15 = extraout_DL_09;
        if (local_18d8 != (undefined1  [8])local_18c8) {
          operator_delete((void *)local_18d8,(long)local_18c8 + 1);
          uVar15 = extraout_DL_10;
        }
      }
      if (local_1648._M_string_length == 0) {
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  ((string *)local_18d8,(SystemTools *)0x1,(bool)uVar15);
        std::__cxx11::string::operator=((string *)&local_1648,(string *)local_18d8);
        if (local_18d8 != (undefined1  [8])local_18c8) {
          operator_delete((void *)local_18d8,(long)local_18c8 + 1);
        }
        local_18d8 = (undefined1  [8])local_18c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_18d8,"CPACK_PACKAGE_DIRECTORY","");
        bVar7 = cmMakefile::IsSet((cmMakefile *)local_1178,(string *)local_18d8);
        if (local_18d8 != (undefined1  [8])local_18c8) {
          operator_delete((void *)local_18d8,(long)local_18c8 + 1);
        }
        if (!bVar7) {
          local_18d8 = (undefined1  [8])local_18c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_18d8,"CPACK_PACKAGE_DIRECTORY","");
          cmMakefile::AddDefinition
                    ((cmMakefile *)local_1178,(string *)local_18d8,local_1648._M_dataplus._M_p);
          goto LAB_00140ef4;
        }
      }
      else {
        local_18d8 = (undefined1  [8])local_18c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_18d8,"CPACK_PACKAGE_DIRECTORY","");
        cmMakefile::AddDefinition
                  ((cmMakefile *)local_1178,(string *)local_18d8,local_1648._M_dataplus._M_p);
LAB_00140ef4:
        if (local_18d8 != (undefined1  [8])local_18c8) {
          operator_delete((void *)local_18d8,(long)local_18c8 + 1);
        }
      }
      if ((_Rb_tree_header *)local_13e0._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_13e0._M_impl.super__Rb_tree_header) {
        p_Var12 = local_13e0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          cmMakefile::AddDefinition
                    ((cmMakefile *)local_1178,(string *)(p_Var12 + 1),*(char **)(p_Var12 + 2));
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        } while ((_Rb_tree_header *)p_Var12 != &local_13e0._M_impl.super__Rb_tree_header);
      }
      local_18d8 = (undefined1  [8])local_18c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_18d8,"CPACK_MODULE_PATH","");
      pcVar13 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_18d8);
      if (local_18d8 != (undefined1  [8])local_18c8) {
        operator_delete((void *)local_18d8,(long)local_18c8 + 1);
      }
      if (pcVar13 != (char *)0x0) {
        local_18d8 = (undefined1  [8])local_18c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_18d8,"CMAKE_MODULE_PATH","")
        ;
        cmMakefile::AddDefinition((cmMakefile *)local_1178,(string *)local_18d8,pcVar13);
        if (local_18d8 != (undefined1  [8])local_18c8) {
          operator_delete((void *)local_18d8,(long)local_18c8 + 1);
        }
      }
      local_18d8 = (undefined1  [8])local_18c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_18d8,"CPACK_GENERATOR","");
      pcVar13 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_18d8);
      if (local_18d8 != (undefined1  [8])local_18c8) {
        operator_delete((void *)local_18d8,(long)local_18c8 + 1);
      }
      if (pcVar13 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_18d8,"CPack generator not specified",0x1d);
        std::endl<char,std::char_traits<char>>((ostream *)local_18d8);
        std::__cxx11::stringbuf::str();
        uVar4 = local_1938._0_8_;
        sVar10 = strlen((char *)local_1938._0_8_);
        cmCPackLog::Log((cmCPackLog *)local_13a8,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                        ,0x14d,(char *)uVar4,sVar10);
        if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
          operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18d8);
        std::ios_base::~ios_base((ios_base *)(local_1870 + 8));
        uVar17 = 0;
        uVar16 = 1;
      }
      else {
        local_1528.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
        local_1528.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
        local_1528.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_18d8 = (undefined1  [8])local_18c8;
        sVar10 = strlen(pcVar13);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_18d8,pcVar13,pcVar13 + sVar10);
        cmSystemTools::ExpandListArgument((string *)local_18d8,&local_1528,false);
        if (local_18d8 != (undefined1  [8])local_18c8) {
          operator_delete((void *)local_18d8,(long)local_18c8 + 1);
        }
        local_18e0 = local_1528.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        local_14c8 = local_1528.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        local_1744 = (uint)CONCAT71((int7)((ulong)local_1528.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 8),
                                    local_1528.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start ==
                                    local_1528.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
        if (local_1528.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_1528.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          uVar17 = 0;
        }
        else {
          local_18e8 = &local_16c8;
          local_1750 = (pointer)(local_1670 + 0x10);
          local_16e8 = &local_1608.field_2;
          local_1758 = &local_1690.field_2;
          local_16f0._M_p = (pointer)&local_1628.field_2;
          uVar17 = 0;
          do {
            cmMakefile::PushScope((cmMakefile *)local_1178);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_18d8,"Specified generator: ",0x15);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_18d8,(local_18e0->_M_dataplus)._M_p,
                                 local_18e0->_M_string_length);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            uVar4 = local_1938._0_8_;
            sVar10 = strlen((char *)local_1938._0_8_);
            cmCPackLog::Log((cmCPackLog *)local_13a8,2,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                            ,0x155,(char *)uVar4,sVar10);
            if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
              operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18d8);
            std::ios_base::~ios_base((ios_base *)(local_1870 + 8));
            if (iVar9 == 0) {
              bVar7 = false;
            }
            else {
              local_15e8._M_dataplus._M_p = (pointer)&local_15e8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_15e8,"CPACK_PACKAGE_NAME","");
              pcVar13 = cmMakefile::GetDefinition((cmMakefile *)local_1178,&local_15e8);
              bVar7 = pcVar13 == (char *)0x0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_15e8._M_dataplus._M_p != &local_15e8.field_2) {
                operator_delete(local_15e8._M_dataplus._M_p,
                                local_15e8.field_2._M_allocated_capacity + 1);
              }
            }
            cVar2 = (char)(cmDocumentation *)local_18d8;
            if (bVar7) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_18d8,"CPack project name not specified",0x20);
              std::ios::widen((char)*(undefined8 *)((long)local_18d8 + -0x18) + cVar2);
              std::ostream::put(cVar2);
              std::ostream::flush();
              std::__cxx11::stringbuf::str();
              uVar4 = local_1938._0_8_;
              sVar10 = strlen((char *)local_1938._0_8_);
              cmCPackLog::Log((cmCPackLog *)local_13a8,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                              ,0x158,(char *)uVar4,sVar10);
              if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
                operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18d8);
              std::ios_base::~ios_base((ios_base *)(local_1870 + 8));
              iVar9 = 0;
            }
            if (iVar9 == 0) {
              bVar7 = false;
LAB_001414c0:
              bVar19 = false;
              bVar3 = false;
              bVar18 = false;
            }
            else {
              local_16e0._8_8_ = &local_16c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)(local_16e0 + 8),"CPACK_PACKAGE_VERSION","");
              pcVar13 = cmMakefile::GetDefinition
                                  ((cmMakefile *)local_1178,(string *)(local_16e0 + 8));
              bVar7 = pcVar13 == (char *)0x0;
              if (!bVar7) goto LAB_001414c0;
              local_1670._0_8_ = local_1670 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1670,"CPACK_PACKAGE_VERSION_MAJOR","");
              pcVar13 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1670);
              if (pcVar13 == (char *)0x0) {
                bVar19 = false;
LAB_0014207c:
                bVar3 = false;
                bVar7 = true;
                bVar18 = true;
              }
              else {
                local_1608._M_dataplus._M_p = (pointer)&local_1608.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1608,"CPACK_PACKAGE_VERSION_MINOR","");
                pcVar13 = cmMakefile::GetDefinition((cmMakefile *)local_1178,&local_1608);
                if (pcVar13 == (char *)0x0) {
                  bVar19 = true;
                  goto LAB_0014207c;
                }
                local_14e8._M_dataplus._M_p = (pointer)&local_14e8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_14e8,"CPACK_PACKAGE_VERSION_PATCH","");
                pcVar13 = cmMakefile::GetDefinition((cmMakefile *)local_1178,&local_14e8);
                bVar18 = pcVar13 == (char *)0x0;
                bVar7 = true;
                bVar19 = true;
                bVar3 = true;
              }
            }
            if ((bVar3) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_14e8._M_dataplus._M_p != &local_14e8.field_2)) {
              operator_delete(local_14e8._M_dataplus._M_p,
                              local_14e8.field_2._M_allocated_capacity + 1);
            }
            if ((bVar19) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1608._M_dataplus._M_p != &local_1608.field_2)) {
              operator_delete(local_1608._M_dataplus._M_p,
                              local_1608.field_2._M_allocated_capacity + 1);
            }
            if ((bVar7) && ((undefined1 *)local_1670._0_8_ != local_1670 + 0x10)) {
              operator_delete((void *)local_1670._0_8_,local_1670._16_8_ + 1);
            }
            if ((iVar9 != 0) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_16e0._8_8_ != &local_16c8)) {
              operator_delete((void *)local_16e0._8_8_,local_16c8._M_allocated_capacity + 1);
            }
            if (bVar18) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_18d8,"CPack project version not specified",0x23);
              std::ios::widen((char)*(undefined8 *)((long)local_18d8 + -0x18) + cVar2);
              std::ostream::put(cVar2);
              poVar11 = (ostream *)std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,
                         "Specify CPACK_PACKAGE_VERSION, or CPACK_PACKAGE_VERSION_MAJOR, CPACK_PACKAGE_VERSION_MINOR, and CPACK_PACKAGE_VERSION_PATCH."
                         ,0x7c);
              std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              std::__cxx11::stringbuf::str();
              uVar4 = local_1938._0_8_;
              sVar10 = strlen((char *)local_1938._0_8_);
              cmCPackLog::Log((cmCPackLog *)local_13a8,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                              ,0x167,(char *)uVar4,sVar10);
              if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
                operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18d8);
              std::ios_base::~ios_base((ios_base *)(local_1870 + 8));
              iVar9 = 0;
            }
            if (iVar9 == 0) {
LAB_00141cc4:
              bVar7 = true;
              iVar9 = 0;
            }
            else {
              local_16e0._0_8_ = cmCPackGeneratorFactory::NewGenerator(&local_11f8,local_18e0);
              if ((cmCPackGenerator *)local_16e0._0_8_ == (cmCPackGenerator *)0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_18d8,"Could not create CPack generator: ",0x22);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_18d8,(local_18e0->_M_dataplus)._M_p,
                                     local_18e0->_M_string_length);
                std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                std::__cxx11::stringbuf::str();
                uVar4 = local_1938._0_8_;
                sVar10 = strlen((char *)local_1938._0_8_);
                cmCPackLog::Log((cmCPackLog *)local_13a8,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                ,0x172,(char *)uVar4,sVar10);
                if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
                  operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18d8);
                std::ios_base::~ios_base((ios_base *)(local_1870 + 8));
                cmDocumentation::cmDocumentation((cmDocumentation *)local_18d8);
                local_16b8.
                super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_16b8.
                super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_16b8.
                super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                for (p_Var12 = local_11f8.GeneratorDescriptions._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_left;
                    (_Rb_tree_header *)p_Var12 !=
                    &local_11f8.GeneratorDescriptions._M_t._M_impl.super__Rb_tree_header;
                    p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
                  local_1938._0_8_ = local_1938 + 0x10;
                  local_1938._8_8_ = (pointer)0x0;
                  local_1938._16_8_ = local_1938._16_8_ & 0xffffffffffffff00;
                  local_1918._M_p = (pointer)&local_1908;
                  local_1910 = 0;
                  local_1908._M_local_buf[0] = '\0';
                  local_18f8 = ' ';
                  std::__cxx11::string::_M_assign((string *)local_1938);
                  std::__cxx11::string::_M_assign((string *)&local_1918);
                  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
                  emplace_back<cmDocumentationEntry>(&local_16b8,(cmDocumentationEntry *)local_1938)
                  ;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1918._M_p != &local_1908) {
                    operator_delete(local_1918._M_p,
                                    CONCAT71(local_1908._M_allocated_capacity._1_7_,
                                             local_1908._M_local_buf[0]) + 1);
                  }
                  if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
                    operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
                  }
                }
                cmDocumentation::SetSection((cmDocumentation *)local_18d8,"Generators",&local_16b8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
                cmDocumentation::PrintDocumentation
                          ((cmDocumentation *)local_18d8,ListGenerators,(ostream *)&std::cerr);
                std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
                          (&local_16b8);
                cmDocumentationFormatter::~cmDocumentationFormatter(local_1848);
                std::
                vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
                ::~vector(&local_1860);
                if (local_1880._M_p != local_1870) {
                  operator_delete(local_1880._M_p,(ulong)(local_1870._0_8_ + 1));
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>_>
                             *)&local_18b0);
                if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)_Stack_18d0._M_p !=
                    (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_18c0) {
                  operator_delete(_Stack_18d0._M_p,local_18c0._0_8_ + 1);
                }
                iVar9 = 0;
              }
              else {
                ((cmCPackGenerator *)local_16e0._0_8_)->Trace = local_193b;
                ((cmCPackGenerator *)local_16e0._0_8_)->TraceExpand = local_193c;
              }
              if (iVar9 == 0) {
LAB_00141a20:
                iVar9 = 0;
              }
              else {
                iVar8 = cmCPackGenerator::Initialize
                                  ((cmCPackGenerator *)local_16e0._0_8_,local_18e0,
                                   (cmMakefile *)local_1178);
                if (iVar8 == 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_18d8,"Cannot initialize the generator ",0x20);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_18d8,(local_18e0->_M_dataplus)._M_p,
                                       local_18e0->_M_string_length);
                  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                  std::ostream::put((char)poVar11);
                  std::ostream::flush();
                  std::__cxx11::stringbuf::str();
                  uVar4 = local_1938._0_8_;
                  sVar10 = strlen((char *)local_1938._0_8_);
                  cmCPackLog::Log((cmCPackLog *)local_13a8,0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                  ,0x186,(char *)uVar4,sVar10);
                  if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
                    operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18d8);
                  std::ios_base::~ios_base((ios_base *)(local_1870 + 8));
                  goto LAB_00141a20;
                }
              }
              local_18d8 = (undefined1  [8])local_18c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_18d8,"CPACK_INSTALL_COMMANDS","");
              pcVar13 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_18d8);
              if (pcVar13 == (char *)0x0) {
                local_1690._M_dataplus._M_p = (pointer)&local_1690.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1690,"CPACK_INSTALL_SCRIPT","");
                pcVar14 = cmMakefile::GetDefinition((cmMakefile *)local_1178,&local_1690);
                if (pcVar14 != (char *)0x0) goto LAB_00141aa4;
                local_1628._M_dataplus._M_p = (pointer)&local_1628.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1628,"CPACK_INSTALLED_DIRECTORIES","");
                pcVar14 = cmMakefile::GetDefinition((cmMakefile *)local_1178,&local_1628);
                if (pcVar14 != (char *)0x0) {
                  bVar7 = true;
                  goto LAB_00141aa7;
                }
                local_1508._M_dataplus._M_p = (pointer)&local_1508.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1508,"CPACK_INSTALL_CMAKE_PROJECTS","");
                pcVar14 = cmMakefile::GetDefinition((cmMakefile *)local_1178,&local_1508);
                bVar19 = pcVar14 == (char *)0x0;
                bVar7 = true;
                bVar3 = true;
              }
              else {
LAB_00141aa4:
                bVar7 = false;
LAB_00141aa7:
                bVar3 = false;
                bVar19 = false;
              }
              if ((bVar3) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1508._M_dataplus._M_p != &local_1508.field_2)) {
                operator_delete(local_1508._M_dataplus._M_p,
                                local_1508.field_2._M_allocated_capacity + 1);
              }
              if ((bVar7) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1628._M_dataplus._M_p != &local_1628.field_2)) {
                operator_delete(local_1628._M_dataplus._M_p,
                                local_1628.field_2._M_allocated_capacity + 1);
              }
              if ((pcVar13 == (char *)0x0) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1690._M_dataplus._M_p != &local_1690.field_2)) {
                operator_delete(local_1690._M_dataplus._M_p,
                                local_1690.field_2._M_allocated_capacity + 1);
              }
              if (local_18d8 != (undefined1  [8])local_18c8) {
                operator_delete((void *)local_18d8,(long)local_18c8 + 1);
              }
              if (bVar19) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_18d8,
                           "Please specify build tree of the project that uses CMake using CPACK_INSTALL_CMAKE_PROJECTS, specify CPACK_INSTALL_COMMANDS, CPACK_INSTALL_SCRIPT, or CPACK_INSTALLED_DIRECTORIES."
                           ,0xb2);
                std::ios::widen((char)*(undefined8 *)((long)local_18d8 + -0x18) + cVar2);
                std::ostream::put(cVar2);
                std::ostream::flush();
                std::__cxx11::stringbuf::str();
                uVar4 = local_1938._0_8_;
                sVar10 = strlen((char *)local_1938._0_8_);
                cmCPackLog::Log((cmCPackLog *)local_13a8,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                ,0x194,(char *)uVar4,sVar10);
                if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
                  operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18d8);
                std::ios_base::~ios_base((ios_base *)(local_1870 + 8));
                iVar9 = 0;
              }
              if (iVar9 == 0) goto LAB_00141cc4;
              local_18d8 = (undefined1  [8])local_18c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_18d8,"CPACK_PACKAGE_NAME","");
              local_1650 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_18d8);
              if (local_18d8 != (undefined1  [8])local_18c8) {
                operator_delete((void *)local_18d8,(long)local_18c8 + 1);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_18d8,"Use generator: ",0xf);
              pcVar13 = (char *)(*(code *)**(undefined8 **)local_16e0._0_8_)();
              if (pcVar13 == (char *)0x0) {
                std::ios::clear((int)auStack_1948 + (int)*(undefined8 *)((long)local_18d8 + -0x18) +
                                0x70);
              }
              else {
                sVar10 = strlen(pcVar13);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_18d8,pcVar13,sVar10);
              }
              std::ios::widen((char)*(undefined8 *)((long)local_18d8 + -0x18) + cVar2);
              std::ostream::put(cVar2);
              std::ostream::flush();
              std::__cxx11::stringbuf::str();
              uVar4 = local_1938._0_8_;
              sVar10 = strlen((char *)local_1938._0_8_);
              cmCPackLog::Log((cmCPackLog *)local_13a8,2,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                              ,0x19b,(char *)uVar4,sVar10);
              if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
                operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18d8);
              std::ios_base::~ios_base((ios_base *)(local_1870 + 8));
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_18d8,"For project: ",0xd);
              pcVar13 = local_1650;
              if (local_1650 == (char *)0x0) {
                std::ios::clear((int)auStack_1948 + (int)*(undefined8 *)((long)local_18d8 + -0x18) +
                                0x70);
              }
              else {
                sVar10 = strlen(local_1650);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_18d8,pcVar13,sVar10);
              }
              std::ios::widen((char)*(undefined8 *)((long)local_18d8 + -0x18) + cVar2);
              std::ostream::put(cVar2);
              std::ostream::flush();
              std::__cxx11::stringbuf::str();
              uVar4 = local_1938._0_8_;
              sVar10 = strlen((char *)local_1938._0_8_);
              cmCPackLog::Log((cmCPackLog *)local_13a8,2,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                              ,0x19d,(char *)uVar4,sVar10);
              if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
                operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18d8);
              std::ios_base::~ios_base((ios_base *)(local_1870 + 8));
              local_18d8 = (undefined1  [8])local_18c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_18d8,"CPACK_PACKAGE_VERSION","");
              pcVar13 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_18d8);
              if (local_18d8 != (undefined1  [8])local_18c8) {
                operator_delete((void *)local_18d8,(long)local_18c8 + 1);
              }
              if (pcVar13 == (char *)0x0) {
                local_18d8 = (undefined1  [8])local_18c8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_18d8,"CPACK_PACKAGE_VERSION_MAJOR","");
                pcVar13 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_18d8);
                if (local_18d8 != (undefined1  [8])local_18c8) {
                  operator_delete((void *)local_18d8,(long)local_18c8 + 1);
                }
                local_18d8 = (undefined1  [8])local_18c8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_18d8,"CPACK_PACKAGE_VERSION_MINOR","");
                pcVar14 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_18d8);
                if (local_18d8 != (undefined1  [8])local_18c8) {
                  operator_delete((void *)local_18d8,(long)local_18c8 + 1);
                }
                local_18d8 = (undefined1  [8])local_18c8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_18d8,"CPACK_PACKAGE_VERSION_PATCH","");
                __s = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_18d8);
                if (local_18d8 != (undefined1  [8])local_18c8) {
                  operator_delete((void *)local_18d8,(long)local_18c8 + 1);
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
                if (pcVar13 == (char *)0x0) {
                  std::ios::clear((int)auStack_1948 + (int)*(undefined8 *)((long)local_18d8 + -0x18)
                                  + 0x70);
                }
                else {
                  sVar10 = strlen(pcVar13);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_18d8,pcVar13,sVar10);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_18d8,".",1);
                if (pcVar14 == (char *)0x0) {
                  std::ios::clear((int)auStack_1948 + (int)*(undefined8 *)((long)local_18d8 + -0x18)
                                  + 0x70);
                }
                else {
                  sVar10 = strlen(pcVar14);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_18d8,pcVar14,sVar10);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_18d8,".",1);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)auStack_1948 + (int)*(undefined8 *)((long)local_18d8 + -0x18)
                                  + 0x70);
                }
                else {
                  sVar10 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_18d8,__s,sVar10);
                }
                local_1938._0_8_ = local_1938 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1938,"CPACK_PACKAGE_VERSION","");
                std::__cxx11::stringbuf::str();
                cmMakefile::AddDefinition
                          ((cmMakefile *)local_1178,(string *)local_1938,
                           (char *)local_16b8.
                                   super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                if (local_16b8.
                    super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    (pointer)&local_16b8.
                              super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  operator_delete(local_16b8.
                                  super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (ulong)((long)&((local_16b8.
                                                                                                      
                                                  super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->Name)._M_dataplus._M_p + 1));
                }
                if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
                  operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18d8);
                std::ios_base::~ios_base((ios_base *)(local_1870 + 8));
              }
              iVar8 = (**(code **)(*(long *)local_16e0._0_8_ + 8))();
              bVar7 = iVar8 != 0;
              if (!bVar7) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_18d8,"Error when generating package: ",0x1f);
                pcVar13 = local_1650;
                if (local_1650 == (char *)0x0) {
                  std::ios::clear((int)auStack_1948 + (int)*(undefined8 *)((long)local_18d8 + -0x18)
                                  + 0x70);
                }
                else {
                  sVar10 = strlen(local_1650);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_18d8,pcVar13,sVar10);
                }
                std::ios::widen((char)*(undefined8 *)((long)local_18d8 + -0x18) + cVar2);
                std::ostream::put(cVar2);
                std::ostream::flush();
                std::__cxx11::stringbuf::str();
                uVar4 = local_1938._0_8_;
                sVar10 = strlen((char *)local_1938._0_8_);
                cmCPackLog::Log((cmCPackLog *)local_13a8,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                                ,0x1b2,(char *)uVar4,sVar10);
                if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
                  operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18d8);
                std::ios_base::~ios_base((ios_base *)(local_1870 + 8));
                uVar17 = 1;
              }
            }
            cmMakefile::PopScope((cmMakefile *)local_1178);
            if (!bVar7) break;
            local_18e0 = local_18e0 + 1;
            local_1744 = (uint)CONCAT71((int7)((ulong)local_18e0 >> 8),local_18e0 == local_14c8);
          } while (local_18e0 != local_14c8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1528);
        uVar16 = local_1744;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_18d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_18d8,"Error reading CMakeDetermineSystem.cmake",0x28);
      std::ios::widen((char)(ostream *)local_18d8 + (char)*(undefined8 *)((long)local_18d8 + -0x18))
      ;
      std::ostream::put((char)local_18d8);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      uVar4 = local_1938._0_8_;
      sVar10 = strlen((char *)local_1938._0_8_);
      cmCPackLog::Log((cmCPackLog *)local_13a8,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cpack.cxx"
                      ,0x101,(char *)uVar4,sVar10);
LAB_0014074a:
      if ((undefined1 *)local_1938._0_8_ != local_1938 + 0x10) {
        operator_delete((void *)local_1938._0_8_,local_1938._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_18d8);
      std::ios_base::~ios_base((ios_base *)(local_1870 + 8));
      uVar17 = 1;
      uVar16 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14c0._M_dataplus._M_p != &local_14c0.field_2) {
      operator_delete(local_14c0._M_dataplus._M_p,local_14c0.field_2._M_allocated_capacity + 1);
    }
    if ((uVar16 & 1) != 0) goto LAB_001407ab;
  }
  cmDocumentationFormatter::~cmDocumentationFormatter(&local_12a0.Formatter);
  std::
  vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>::
  ~vector(&local_12a0.RequestedHelpItems);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12a0.CurrentArgument._M_dataplus._M_p != &local_12a0.CurrentArgument.field_2) {
    operator_delete(local_12a0.CurrentArgument._M_dataplus._M_p,
                    local_12a0.CurrentArgument.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>_>
  ::~_Rb_tree(&local_12a0.AllSections._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12a0.NameString._M_dataplus._M_p != &local_12a0.NameString.field_2) {
    operator_delete(local_12a0.NameString._M_dataplus._M_p,
                    local_12a0.NameString.field_2._M_allocated_capacity + 1);
  }
  cmCPackGeneratorFactory::~cmCPackGeneratorFactory(&local_11f8);
  cmMakefile::~cmMakefile((cmMakefile *)local_1178);
  cmGlobalGenerator::~cmGlobalGenerator(&local_990);
  cmake::~cmake(&local_388);
  cmsys::CommandLineArguments::~CommandLineArguments(&local_1720);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_13e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1740._M_dataplus._M_p != &local_1740.field_2) {
    operator_delete(local_1740._M_dataplus._M_p,
                    CONCAT71(local_1740.field_2._M_allocated_capacity._1_7_,
                             local_1740.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c8._M_dataplus._M_p != &local_15c8.field_2) {
    operator_delete(local_15c8._M_dataplus._M_p,
                    CONCAT71(local_15c8.field_2._M_allocated_capacity._1_7_,
                             local_15c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14a0._M_dataplus._M_p != &local_14a0.field_2) {
    operator_delete(local_14a0._M_dataplus._M_p,
                    CONCAT71(local_14a0.field_2._M_allocated_capacity._1_7_,
                             local_14a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15a8._M_dataplus._M_p != &local_15a8.field_2) {
    operator_delete(local_15a8._M_dataplus._M_p,
                    CONCAT71(local_15a8.field_2._M_allocated_capacity._1_7_,
                             local_15a8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1588._M_dataplus._M_p != &local_1588.field_2) {
    operator_delete(local_1588._M_dataplus._M_p,
                    CONCAT71(local_1588.field_2._M_allocated_capacity._1_7_,
                             local_1588.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1648._M_dataplus._M_p != &local_1648.field_2) {
    operator_delete(local_1648._M_dataplus._M_p,
                    CONCAT71(local_1648.field_2._M_allocated_capacity._1_7_,
                             local_1648.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1568._M_dataplus._M_p != &local_1568.field_2) {
    operator_delete(local_1568._M_dataplus._M_p,
                    CONCAT71(local_1568.field_2._M_allocated_capacity._1_7_,
                             local_1568.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1480._M_dataplus._M_p != &local_1480.field_2) {
    operator_delete(local_1480._M_dataplus._M_p,
                    CONCAT71(local_1480.field_2._M_allocated_capacity._1_7_,
                             local_1480.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1460._M_dataplus._M_p != &local_1460.field_2) {
    operator_delete(local_1460._M_dataplus._M_p,
                    CONCAT71(local_1460.field_2._M_allocated_capacity._1_7_,
                             local_1460.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1440._M_dataplus._M_p != &local_1440.field_2) {
    operator_delete(local_1440._M_dataplus._M_p,
                    CONCAT71(local_1440.field_2._M_allocated_capacity._1_7_,
                             local_1440.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1548._M_dataplus._M_p != &local_1548.field_2) {
    operator_delete(local_1548._M_dataplus._M_p,
                    CONCAT71(local_1548.field_2._M_allocated_capacity._1_7_,
                             local_1548.field_2._M_local_buf[0]) + 1);
  }
LAB_00140bf2:
  cmCPackLog::~cmCPackLog((cmCPackLog *)local_13a8);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&local_1420);
  return uVar17;
}

Assistant:

int main(int argc, char const* const* argv)
{
#if defined(_WIN32) && defined(CMAKE_BUILD_WITH_CMAKE)
  // Replace streambuf so we can output Unicode to console
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
  consoleOut.SetUTF8Pipes();
  cmsys::ConsoleBuf::Manager consoleErr(std::cerr, true);
  consoleErr.SetUTF8Pipes();
#endif
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(argc, argv);
  argc = args.argc();
  argv = args.argv();

  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(argv[0]);
  cmCPackLog log;

  log.SetErrorPrefix("CPack Error: ");
  log.SetWarningPrefix("CPack Warning: ");
  log.SetOutputPrefix("CPack: ");
  log.SetVerbosePrefix("CPack Verbose: ");

  if (cmSystemTools::GetCurrentWorkingDirectory().empty()) {
    cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                "Current working directory cannot be established."
                  << std::endl);
    return 1;
  }

  std::string generator;
  bool help = false;
  bool helpVersion = false;
  bool verbose = false;
  bool trace = false;
  bool traceExpand = false;
  bool debug = false;
  std::string helpFull;
  std::string helpMAN;
  std::string helpHTML;

  std::string cpackProjectName;
  std::string cpackProjectDirectory;
  std::string cpackBuildConfig;
  std::string cpackProjectVersion;
  std::string cpackProjectPatch;
  std::string cpackProjectVendor;
  std::string cpackConfigFile;

  cpackDefinitions definitions;
  definitions.Log = &log;

  cpackConfigFile.clear();

  cmsys::CommandLineArguments arg;
  arg.Initialize(argc, argv);
  typedef cmsys::CommandLineArguments argT;
  // Help arguments
  arg.AddArgument("--help", argT::NO_ARGUMENT, &help, "CPack help");
  arg.AddArgument("--help-full", argT::SPACE_ARGUMENT, &helpFull,
                  "CPack help");
  arg.AddArgument("--help-html", argT::SPACE_ARGUMENT, &helpHTML,
                  "CPack help");
  arg.AddArgument("--help-man", argT::SPACE_ARGUMENT, &helpMAN, "CPack help");
  arg.AddArgument("--version", argT::NO_ARGUMENT, &helpVersion, "CPack help");

  arg.AddArgument("-V", argT::NO_ARGUMENT, &verbose, "CPack verbose");
  arg.AddArgument("--verbose", argT::NO_ARGUMENT, &verbose, "-V");
  arg.AddArgument("--debug", argT::NO_ARGUMENT, &debug, "-V");
  arg.AddArgument("--config", argT::SPACE_ARGUMENT, &cpackConfigFile,
                  "CPack configuration file");
  arg.AddArgument("--trace", argT::NO_ARGUMENT, &trace,
                  "Put underlying cmake scripts in trace mode.");
  arg.AddArgument("--trace-expand", argT::NO_ARGUMENT, &traceExpand,
                  "Put underlying cmake scripts in expanded trace mode.");
  arg.AddArgument("-C", argT::SPACE_ARGUMENT, &cpackBuildConfig,
                  "CPack build configuration");
  arg.AddArgument("-G", argT::SPACE_ARGUMENT, &generator, "CPack generator");
  arg.AddArgument("-P", argT::SPACE_ARGUMENT, &cpackProjectName,
                  "CPack project name");
  arg.AddArgument("-R", argT::SPACE_ARGUMENT, &cpackProjectVersion,
                  "CPack project version");
  arg.AddArgument("-B", argT::SPACE_ARGUMENT, &cpackProjectDirectory,
                  "CPack project directory");
  arg.AddArgument("--patch", argT::SPACE_ARGUMENT, &cpackProjectPatch,
                  "CPack project patch");
  arg.AddArgument("--vendor", argT::SPACE_ARGUMENT, &cpackProjectVendor,
                  "CPack project vendor");
  arg.AddCallback("-D", argT::SPACE_ARGUMENT, cpackDefinitionArgument,
                  &definitions, "CPack Definitions");
  arg.SetUnknownArgumentCallback(cpackUnknownArgument);

  // Parse command line
  int parsed = arg.Parse();

  // Setup logging
  if (verbose) {
    log.SetVerbose(verbose);
    cmCPack_Log(&log, cmCPackLog::LOG_OUTPUT, "Enable Verbose" << std::endl);
  }
  if (debug) {
    log.SetDebug(debug);
    cmCPack_Log(&log, cmCPackLog::LOG_OUTPUT, "Enable Debug" << std::endl);
  }

  cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
              "Read CPack config file: " << cpackConfigFile << std::endl);

  cmake cminst(cmake::RoleScript, cmState::CPack);
  cminst.SetHomeDirectory("");
  cminst.SetHomeOutputDirectory("");
  cminst.SetProgressCallback(cpackProgressCallback);
  cminst.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator cmgg(&cminst);
  cmMakefile globalMF(&cmgg, cminst.GetCurrentSnapshot());
#if defined(__CYGWIN__)
  globalMF.AddDefinition("CMAKE_LEGACY_CYGWIN_WIN32", "0");
#endif

  if (trace) {
    cminst.SetTrace(true);
  }
  if (traceExpand) {
    cminst.SetTrace(true);
    cminst.SetTraceExpand(true);
  }

  bool cpackConfigFileSpecified = true;
  if (cpackConfigFile.empty()) {
    cpackConfigFile = cmSystemTools::GetCurrentWorkingDirectory();
    cpackConfigFile += "/CPackConfig.cmake";
    cpackConfigFileSpecified = false;
  }

  cmCPackGeneratorFactory generators;
  generators.SetLogger(&log);
  cmCPackGenerator* cpackGenerator = nullptr;

  cmDocumentation doc;
  doc.addCPackStandardDocSections();
  /* Were we invoked to display doc or to do some work ?
   * Unlike cmake launching cpack with zero argument
   * should launch cpack using "cpackConfigFile" if it exists
   * in the current directory.
   */
  help = doc.CheckOptions(argc, argv, "-G") && argc != 1;

  // This part is used for cpack documentation lookup as well.
  cminst.AddCMakePaths();

  if (parsed && !help) {
    // find out which system cpack is running on, so it can setup the search
    // paths, so FIND_XXX() commands can be used in scripts
    std::string systemFile =
      globalMF.GetModulesFile("CMakeDetermineSystem.cmake");
    if (!globalMF.ReadListFile(systemFile)) {
      cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                  "Error reading CMakeDetermineSystem.cmake" << std::endl);
      return 1;
    }

    systemFile =
      globalMF.GetModulesFile("CMakeSystemSpecificInformation.cmake");
    if (!globalMF.ReadListFile(systemFile)) {
      cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                  "Error reading CMakeSystemSpecificInformation.cmake"
                    << std::endl);
      return 1;
    }

    if (!cpackBuildConfig.empty()) {
      globalMF.AddDefinition("CPACK_BUILD_CONFIG", cpackBuildConfig.c_str());
    }

    if (cmSystemTools::FileExists(cpackConfigFile)) {
      cpackConfigFile = cmSystemTools::CollapseFullPath(cpackConfigFile);
      cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
                  "Read CPack configuration file: " << cpackConfigFile
                                                    << std::endl);
      if (!globalMF.ReadListFile(cpackConfigFile)) {
        cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                    "Problem reading CPack config file: \""
                      << cpackConfigFile << "\"" << std::endl);
        return 1;
      }
    } else if (cpackConfigFileSpecified) {
      cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                  "Cannot find CPack config file: \"" << cpackConfigFile
                                                      << "\"" << std::endl);
      return 1;
    }

    if (!generator.empty()) {
      globalMF.AddDefinition("CPACK_GENERATOR", generator.c_str());
    }
    if (!cpackProjectName.empty()) {
      globalMF.AddDefinition("CPACK_PACKAGE_NAME", cpackProjectName.c_str());
    }
    if (!cpackProjectVersion.empty()) {
      globalMF.AddDefinition("CPACK_PACKAGE_VERSION",
                             cpackProjectVersion.c_str());
    }
    if (!cpackProjectVendor.empty()) {
      globalMF.AddDefinition("CPACK_PACKAGE_VENDOR",
                             cpackProjectVendor.c_str());
    }
    // if this is not empty it has been set on the command line
    // go for it. Command line override values set in config file.
    if (!cpackProjectDirectory.empty()) {
      globalMF.AddDefinition("CPACK_PACKAGE_DIRECTORY",
                             cpackProjectDirectory.c_str());
    }
    // The value has not been set on the command line
    else {
      // get a default value (current working directory)
      cpackProjectDirectory = cmsys::SystemTools::GetCurrentWorkingDirectory();
      // use default value iff no value has been provided by the config file
      if (!globalMF.IsSet("CPACK_PACKAGE_DIRECTORY")) {
        globalMF.AddDefinition("CPACK_PACKAGE_DIRECTORY",
                               cpackProjectDirectory.c_str());
      }
    }
    for (auto const& cd : definitions.Map) {
      globalMF.AddDefinition(cd.first, cd.second.c_str());
    }

    const char* cpackModulesPath = globalMF.GetDefinition("CPACK_MODULE_PATH");
    if (cpackModulesPath) {
      globalMF.AddDefinition("CMAKE_MODULE_PATH", cpackModulesPath);
    }
    const char* genList = globalMF.GetDefinition("CPACK_GENERATOR");
    if (!genList) {
      cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                  "CPack generator not specified" << std::endl);
    } else {
      std::vector<std::string> generatorsVector;
      cmSystemTools::ExpandListArgument(genList, generatorsVector);
      for (std::string const& gen : generatorsVector) {
        cmMakefile::ScopePushPop raii(&globalMF);
        cmMakefile* mf = &globalMF;
        cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
                    "Specified generator: " << gen << std::endl);
        if (parsed && !mf->GetDefinition("CPACK_PACKAGE_NAME")) {
          cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                      "CPack project name not specified" << std::endl);
          parsed = 0;
        }
        if (parsed &&
            !(mf->GetDefinition("CPACK_PACKAGE_VERSION") ||
              (mf->GetDefinition("CPACK_PACKAGE_VERSION_MAJOR") &&
               mf->GetDefinition("CPACK_PACKAGE_VERSION_MINOR") &&
               mf->GetDefinition("CPACK_PACKAGE_VERSION_PATCH")))) {
          cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                      "CPack project version not specified"
                        << std::endl
                        << "Specify CPACK_PACKAGE_VERSION, or "
                           "CPACK_PACKAGE_VERSION_MAJOR, "
                           "CPACK_PACKAGE_VERSION_MINOR, and "
                           "CPACK_PACKAGE_VERSION_PATCH."
                        << std::endl);
          parsed = 0;
        }
        if (parsed) {
          cpackGenerator = generators.NewGenerator(gen);
          if (cpackGenerator) {
            cpackGenerator->SetTrace(trace);
            cpackGenerator->SetTraceExpand(traceExpand);
          } else {
            cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                        "Could not create CPack generator: " << gen
                                                             << std::endl);
            // Print out all the valid generators
            cmDocumentation generatorDocs;
            std::vector<cmDocumentationEntry> v;
            for (auto const& g : generators.GetGeneratorsList()) {
              cmDocumentationEntry e;
              e.Name = g.first;
              e.Brief = g.second;
              v.push_back(std::move(e));
            }
            generatorDocs.SetSection("Generators", v);
            std::cerr << "\n";
            generatorDocs.PrintDocumentation(cmDocumentation::ListGenerators,
                                             std::cerr);
            parsed = 0;
          }

          if (parsed && !cpackGenerator->Initialize(gen, mf)) {
            cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                        "Cannot initialize the generator " << gen
                                                           << std::endl);
            parsed = 0;
          }

          if (!mf->GetDefinition("CPACK_INSTALL_COMMANDS") &&
              !mf->GetDefinition("CPACK_INSTALL_SCRIPT") &&
              !mf->GetDefinition("CPACK_INSTALLED_DIRECTORIES") &&
              !mf->GetDefinition("CPACK_INSTALL_CMAKE_PROJECTS")) {
            cmCPack_Log(
              &log, cmCPackLog::LOG_ERROR,
              "Please specify build tree of the project that uses CMake "
              "using CPACK_INSTALL_CMAKE_PROJECTS, specify "
              "CPACK_INSTALL_COMMANDS, CPACK_INSTALL_SCRIPT, or "
              "CPACK_INSTALLED_DIRECTORIES."
                << std::endl);
            parsed = 0;
          }
          if (parsed) {
            const char* projName = mf->GetDefinition("CPACK_PACKAGE_NAME");
            cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
                        "Use generator: " << cpackGenerator->GetNameOfClass()
                                          << std::endl);
            cmCPack_Log(&log, cmCPackLog::LOG_VERBOSE,
                        "For project: " << projName << std::endl);

            const char* projVersion =
              mf->GetDefinition("CPACK_PACKAGE_VERSION");
            if (!projVersion) {
              const char* projVersionMajor =
                mf->GetDefinition("CPACK_PACKAGE_VERSION_MAJOR");
              const char* projVersionMinor =
                mf->GetDefinition("CPACK_PACKAGE_VERSION_MINOR");
              const char* projVersionPatch =
                mf->GetDefinition("CPACK_PACKAGE_VERSION_PATCH");
              std::ostringstream ostr;
              ostr << projVersionMajor << "." << projVersionMinor << "."
                   << projVersionPatch;
              mf->AddDefinition("CPACK_PACKAGE_VERSION", ostr.str().c_str());
            }

            int res = cpackGenerator->DoPackage();
            if (!res) {
              cmCPack_Log(&log, cmCPackLog::LOG_ERROR,
                          "Error when generating package: " << projName
                                                            << std::endl);
              return 1;
            }
          }
        }
      }
    }
  }

  /* In this case we are building the documentation object
   * instance in order to create appropriate structure
   * in order to satisfy the appropriate --help-xxx request
   */
  if (help) {
    // Construct and print requested documentation.

    doc.SetName("cpack");
    doc.SetSection("Name", cmDocumentationName);
    doc.SetSection("Usage", cmDocumentationUsage);
    doc.PrependSection("Options", cmDocumentationOptions);

    std::vector<cmDocumentationEntry> v;
    for (auto const& g : generators.GetGeneratorsList()) {
      cmDocumentationEntry e;
      e.Name = g.first;
      e.Brief = g.second;
      v.push_back(std::move(e));
    }
    doc.SetSection("Generators", v);

    return doc.PrintRequestedDocumentation(std::cout) ? 0 : 1;
  }

  if (cmSystemTools::GetErrorOccuredFlag()) {
    return 1;
  }

  return 0;
}